

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyMeshT.cc
# Opt level: O0

void __thiscall
OpenMesh::
PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
::calc_vertex_normal_fast
          (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
           *this,VertexHandle _vh,Normal *_n)

{
  bool bVar1;
  value_type _fh;
  Normal *_rhs;
  undefined1 local_40 [8];
  ConstVertexFaceIter vf_it;
  Normal *_n_local;
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  *this_local;
  VertexHandle _vh_local;
  
  vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ = 0;
  vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = 0;
  VectorT<double,_3>::vectorize
            (_n,(double *)
                &vf_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_);
  PolyConnectivity::cvf_iter
            ((ConstVertexFaceIter *)local_40,(PolyConnectivity *)this,
             (VertexHandle)_vh.super_BaseHandle.idx_);
  while( true ) {
    bVar1 = Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
            ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                        *)local_40);
    if (!bVar1) break;
    _fh = Iterators::
          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
          ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                       *)local_40);
    _rhs = AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
           normal(&this->
                   super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                  ,(FaceHandle)_fh.super_BaseHandle.idx_);
    VectorT<double,_3>::operator+=(_n,_rhs);
    Iterators::
    GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
    ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::FaceHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toFaceHandle>
                  *)local_40);
  }
  return;
}

Assistant:

void PolyMeshT<Kernel>::
calc_vertex_normal_fast(VertexHandle _vh, Normal& _n) const
{
  _n.vectorize(0.0);
  for (ConstVertexFaceIter vf_it = this->cvf_iter(_vh); vf_it.is_valid(); ++vf_it)
    _n += this->normal(*vf_it);
}